

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::MinLayerParams::~MinLayerParams(MinLayerParams *this)

{
  MinLayerParams *this_local;
  
  ~MinLayerParams(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

MinLayerParams::~MinLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.MinLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}